

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1sha256_sign
              (ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
              uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
              uint16_t *algorithms,size_t num_algorithms)

{
  size_t sVar1;
  uECC_Curve curve;
  ulong body_size_00;
  size_t body_size;
  size_t body_start;
  undefined1 local_128 [8];
  cf_sha256_context ctx;
  size_t sStack_b0;
  int ret;
  size_t i;
  uint8_t sig [64];
  uint8_t hash [32];
  ptls_minicrypto_secp256r1sha256_sign_certificate_t *self;
  uint16_t *algorithms_local;
  ptls_buffer_t *outbuf_local;
  uint16_t *selected_algorithm_local;
  ptls_async_job_t **async_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *_self_local;
  
  for (sStack_b0 = 0; (sStack_b0 != num_algorithms && (algorithms[sStack_b0] != 0x403));
      sStack_b0 = sStack_b0 + 1) {
  }
  if (sStack_b0 == num_algorithms) {
    return 0x28;
  }
  cf_sha256_init((cf_sha256_context *)local_128);
  cf_sha256_update((cf_sha256_context *)local_128,input.base,input.len);
  cf_sha256_digest_final((cf_sha256_context *)local_128,sig + 0x38);
  (*ptls_clear_memory)(local_128,0x70);
  curve = uECC_secp256r1();
  uECC_sign((uint8_t *)(_self + 1),sig + 0x38,0x20,(uint8_t *)&i,curve);
  body_start._7_1_ = 0x30;
  ctx.npartial._4_4_ = ptls_buffer__do_pushv(outbuf,(void *)((long)&body_start + 7),1);
  if (ctx.npartial._4_4_ == 0) {
    body_start._6_1_ = 0xff;
    ctx.npartial._4_4_ = ptls_buffer__do_pushv(outbuf,(void *)((long)&body_start + 6),1);
    if (ctx.npartial._4_4_ == 0) {
      sVar1 = outbuf->off;
      ctx.npartial._4_4_ = ptls_buffer_push_asn1_ubigint(outbuf,&i,0x20);
      if ((ctx.npartial._4_4_ == 0) &&
         (ctx.npartial._4_4_ = ptls_buffer_push_asn1_ubigint(outbuf,sig + 0x18,0x20),
         ctx.npartial._4_4_ == 0)) {
        body_size_00 = outbuf->off - sVar1;
        if (body_size_00 < 0x80) {
          outbuf->base[sVar1 - 1] = (uint8_t)body_size_00;
        }
        else {
          ctx.npartial._4_4_ = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size_00);
          if (ctx.npartial._4_4_ != 0) goto LAB_0014ab1d;
        }
        *selected_algorithm = 0x403;
        ctx.npartial._4_4_ = 0;
      }
    }
  }
LAB_0014ab1d:
  (*ptls_clear_memory)(sig + 0x38,0x20);
  (*ptls_clear_memory)(&i,0x40);
  return ctx.npartial._4_4_;
}

Assistant:

static int secp256r1sha256_sign(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                                ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_minicrypto_secp256r1sha256_sign_certificate_t *self = (ptls_minicrypto_secp256r1sha256_sign_certificate_t *)_self;
    uint8_t hash[32], sig[64];
    size_t i;
    int ret;

    /* check algorithm */
    for (i = 0; i != num_algorithms; ++i)
        if (algorithms[i] == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256)
            break;
    if (i == num_algorithms)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(self->key, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    *selected_algorithm = PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256;
    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}